

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe50At3(uint8_t *buf)

{
  return ((ulong)buf[2] |
         (ulong)buf[3] << 8 | (ulong)buf[4] << 0x10 | ((ulong)*(ushort *)(buf + 5) & 0x1fff) << 0x18
         ) << 0xd | (ulong)buf[1] << 5 | (ulong)(*buf >> 3);
}

Assistant:

std::uint64_t readFlUIntLe50At3(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 5;
    res |= (buf[0] >> 3);
    res &= UINT64_C(0x3ffffffffffff);
    return res;
}